

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton1.cpp
# Opt level: O2

void __thiscall SingleDataX::~SingleDataX(SingleDataX *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"SingleDataX::dtor: ");
  poVar1 = std::operator<<(poVar1,"SingleDataX::~SingleDataX()");
  poVar1 = std::operator<<(poVar1," ");
  (*(code *)es::init::singleton<SingleData,_es::init::early_initializer,_void,_std::ios_base::Init>
            ::_get_instance._M_b._M_p)();
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

~SingleDataX()
    {
        std::cout << "SingleDataX::dtor: " << __PRETTY_FUNCTION__ << " "
                  << (void *)&es::init::singleton<SingleData>::instance() << std::endl;
    }